

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Bignum256_32.c
# Opt level: O0

_Bool Hacl_Bignum256_32_mod_exp_consttime
                (uint32_t *n,uint32_t *a,uint32_t bBits,uint32_t *b,uint32_t *res)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t nBits;
  uint32_t is_valid_m;
  uint32_t *res_local;
  uint32_t *b_local;
  uint32_t bBits_local;
  uint32_t *a_local;
  uint32_t *n_local;
  
  uVar1 = exp_check(n,a,bBits,b);
  uVar2 = Hacl_Bignum_Lib_bn_get_top_index_u32(8,n);
  if (uVar1 == 0xffffffff) {
    exp_consttime(uVar2 << 5,n,a,bBits,b,res);
  }
  else {
    memset(res,0,0x20);
  }
  return uVar1 == 0xffffffff;
}

Assistant:

bool
Hacl_Bignum256_32_mod_exp_consttime(
  uint32_t *n,
  uint32_t *a,
  uint32_t bBits,
  uint32_t *b,
  uint32_t *res
)
{
  uint32_t is_valid_m = exp_check(n, a, bBits, b);
  uint32_t nBits = 32U * Hacl_Bignum_Lib_bn_get_top_index_u32(8U, n);
  if (is_valid_m == 0xFFFFFFFFU)
  {
    exp_consttime(nBits, n, a, bBits, b, res);
  }
  else
  {
    memset(res, 0U, 8U * sizeof (uint32_t));
  }
  return is_valid_m == 0xFFFFFFFFU;
}